

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::(anonymous_namespace)::
partition3<pugi::xpath_node,pugi::impl::(anonymous_namespace)::document_order_comparator>
          (_anonymous_namespace_ *this,xpath_node *begin,xpath_node *end,xpath_node pivot,
          document_order_comparator *pred,xpath_node **out_eqbeg,xpath_node **out_eqend)

{
  bool bVar1;
  xpath_node *local_60;
  xpath_node *it;
  xpath_node *eqbeg;
  xpath_node *gt;
  xpath_node *lt;
  xpath_node *eq;
  xpath_node **out_eqbeg_local;
  document_order_comparator *pred_local;
  xpath_node *end_local;
  xpath_node *begin_local;
  xpath_node pivot_local;
  
  pivot_local._node = pivot._node._root;
  eqbeg = begin;
  gt = (xpath_node *)this;
  lt = (xpath_node *)this;
  begin_local = end;
  while (gt < eqbeg) {
    bVar1 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)pivot._attribute._attr._attr,gt,
                       (xpath_node *)&begin_local);
    if (bVar1) {
      gt = gt + 1;
    }
    else {
      bVar1 = xpath_node::operator==(gt,(xpath_node *)&begin_local);
      if (bVar1) {
        anon_unknown_0::swap<pugi::xpath_node>(lt,gt);
        gt = gt + 1;
        lt = lt + 1;
      }
      else {
        eqbeg = eqbeg + -1;
        anon_unknown_0::swap<pugi::xpath_node>(gt,eqbeg);
      }
    }
  }
  it = eqbeg;
  for (local_60 = (xpath_node *)this; local_60 != lt; local_60 = local_60 + 1) {
    it = it + -1;
    anon_unknown_0::swap<pugi::xpath_node>(local_60,it);
  }
  *(xpath_node **)pred = it;
  *out_eqbeg = eqbeg;
  return;
}

Assistant:

PUGI__FN void partition3(T* begin, T* end, T pivot, const Pred& pred, T** out_eqbeg, T** out_eqend)
	{
		// invariant: array is split into 4 groups: = < ? > (each variable denotes the boundary between the groups)
		T* eq = begin;
		T* lt = begin;
		T* gt = end;

		while (lt < gt)
		{
			if (pred(*lt, pivot))
				lt++;
			else if (*lt == pivot)
				swap(*eq++, *lt++);
			else
				swap(*lt, *--gt);
		}

		// we now have just 4 groups: = < >; move equal elements to the middle
		T* eqbeg = gt;

		for (T* it = begin; it != eq; ++it)
			swap(*it, *--eqbeg);

		*out_eqbeg = eqbeg;
		*out_eqend = gt;
	}